

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     outer_product_selector_run<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>,_1,1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>,1,_1,false>,Eigen::internal::generic_product_impl<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>,_1,1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>,1,_1,false>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
               (Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                *dst,Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>
                     *lhs,
               Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>
               *rhs,sub *func,false_type *param_5)

{
  long lVar1;
  PointerType pdVar2;
  long lVar3;
  PointerType pdVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  long lVar9;
  PointerType pdVar10;
  byte bVar11;
  Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true>
  local_180;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>
  local_118;
  undefined8 local_88 [11];
  
  bVar11 = 0;
  pdVar10 = (rhs->
            super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_0>
            .m_data;
  lVar1 = (((rhs->
            super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false,_true>
            .m_xpr.
            super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
           .m_xpr)->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).m_stride.m_outer.m_value;
  pdVar2 = (lhs->
           super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_0>
           .m_data;
  lVar3 = (lhs->
          super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_0>
          .m_rows.m_value;
  puVar7 = (undefined8 *)
           &(lhs->
            super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_0>
            .field_0x10;
  puVar8 = local_88;
  for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 1;
  }
  lVar5 = (dst->
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
          .m_cols.m_value;
  if (0 < lVar5) {
    lVar9 = 0;
    do {
      pdVar4 = (dst->
               super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
               .m_data;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true>,_0>
      .m_rows.m_value =
           (dst->
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
           .m_rows.m_value;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true>,_0>
      .m_data = pdVar4 + (((dst->
                           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
                           ).
                           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
                          .m_xpr)->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         ).m_stride.m_outer.m_value * lVar9;
      if (local_180.
          super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true>,_0>
          .m_rows.m_value < 0 && pdVar4 != (PointerType)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, Level = 0]"
                     );
      }
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_xpr.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_outerStride =
           (dst->
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .m_outerStride;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_xpr.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_data = (dst->
                super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
                .m_data;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_xpr.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_rows.m_value =
           (dst->
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
           .m_rows.m_value;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_xpr.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_cols.m_value =
           (dst->
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
           .m_cols.m_value;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_xpr.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_xpr = (dst->
               super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
               .m_xpr;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_xpr.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startRow.m_value =
           (dst->
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .m_startRow.m_value;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_xpr.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startCol.m_value =
           (dst->
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .m_startCol.m_value;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_startRow.m_value = 0;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_outerStride =
           ((local_180.
             super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
            .m_xpr)->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).m_stride.m_outer.m_value;
      local_180.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,__1,_1,_true,_true>
      .m_startCol.m_value = lVar9;
      if ((dst->
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
          .m_cols.m_value <= lVar9) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      if (lVar3 < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      local_118.m_lhs.m_functor.m_other = *pdVar10;
      puVar7 = local_88;
      puVar8 = (undefined8 *)
               ((long)&local_118.m_rhs.
                       super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_0>
               + 0x10);
      for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      }
      local_118.m_lhs.m_rows.m_value = lVar3;
      local_118.m_rhs.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_0>
      .m_data = pdVar2;
      local_118.m_rhs.
      super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_0>
      .m_rows.m_value = lVar3;
      generic_product_impl<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>,-1,1,false>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,1,-1,false>,1,-1,false>,Eigen::DenseShape,Eigen::DenseShape,5>
      ::sub::operator()(func,&local_180,&local_118);
      lVar9 = lVar9 + 1;
      pdVar10 = pdVar10 + lVar1;
    } while (lVar5 != lVar9);
  }
  return;
}

Assistant:

void EIGEN_DEVICE_FUNC outer_product_selector_run(Dst& dst, const Lhs &lhs, const Rhs &rhs, const Func& func, const false_type&)
{
  evaluator<Rhs> rhsEval(rhs);
  ei_declare_local_nested_eval(Lhs,lhs,Rhs::SizeAtCompileTime,actual_lhs);
  // FIXME if cols is large enough, then it might be useful to make sure that lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dst.cols();
  for (Index j=0; j<cols; ++j)
    func(dst.col(j), rhsEval.coeff(Index(0),j) * actual_lhs);
}